

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary.cpp
# Opt level: O2

bool __thiscall
ArbitraryArbitrary_Arithmetic_IntCast::Run(ArbitraryArbitrary_Arithmetic_IntCast *this)

{
  _Vector_base<signed_char,_std::allocator<signed_char>_> local_18;
  
  testinator::detail::Arbitrary_Arithmetic_IntCast<signed_char>::generate(3,0);
  local_18._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_18._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_18._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base(&local_18);
  return true;
}

Assistant:

DEF_TEST(Arbitrary_Arithmetic_IntCast, Arbitrary)
{
  testinator::Arbitrary<signed char> a;
  signed char v = a.generate(0,0);
  v = a.generate(1,0);
  v = a.generate(2,0);
  v = a.generate(3,0);
  a.shrink(v);
  return true;
}